

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GC.cpp
# Opt level: O0

void __thiscall luna::GC::DestroyGeneration(GC *this,GenInfo *gen)

{
  GCObject *__args;
  function<void_(luna::GCObject_*,_unsigned_int)> *in_RSI;
  undefined8 in_RDI;
  GCObject *obj;
  
  while (*(long *)&(in_RSI->super__Function_base)._M_functor != 0) {
    __args = *(GCObject **)&(in_RSI->super__Function_base)._M_functor;
    *(undefined8 *)&(in_RSI->super__Function_base)._M_functor =
         *(undefined8 *)(*(long *)&(in_RSI->super__Function_base)._M_functor + 8);
    std::function<void_(luna::GCObject_*,_unsigned_int)>::operator()
              (in_RSI,__args,(uint)((ulong)in_RDI >> 0x20));
  }
  *(undefined4 *)((long)&(in_RSI->super__Function_base)._M_functor + 8) = 0;
  return;
}

Assistant:

void GC::DestroyGeneration(GenInfo &gen)
    {
        while (gen.gen_)
        {
            GCObject *obj = gen.gen_;
            gen.gen_ = gen.gen_->next_;
            obj_deleter_(obj, obj->gc_obj_type_);
        }
        gen.count_ = 0;
    }